

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::internal::format_value<wchar_t,TestEnum2>
               (basic_buffer<wchar_t> *buffer,TestEnum2 *value)

{
  undefined8 uVar1;
  int *in_RSI;
  basic_buffer<wchar_t> *in_RDI;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> output;
  formatbuf<wchar_t> format_buf;
  basic_buffer<wchar_t> *in_stack_fffffffffffffe68;
  formatbuf<wchar_t> *in_stack_fffffffffffffe70;
  long local_168 [34];
  wstreambuf local_58 [72];
  int *local_10;
  basic_buffer<wchar_t> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  formatbuf<wchar_t>::formatbuf(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::wostream::wostream(local_168,local_58);
  uVar1 = *(undefined8 *)(local_168[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::wios::exceptions((int)local_168 + (int)uVar1);
  std::wostream::operator<<(local_168,*local_10);
  basic_buffer<wchar_t>::size(local_8);
  basic_buffer<wchar_t>::resize(local_8,(size_t)in_stack_fffffffffffffe68);
  std::wostream::~wostream(local_168);
  formatbuf<wchar_t>::~formatbuf((formatbuf<wchar_t> *)0x16e580);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}